

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly1,
          MP<8UL,_GF2::MOGrevlex<8UL>_> *poly2)

{
  ulong uVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  WW<8UL> local_38;
  
  local_38._words[0] = (word  [1])0;
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  p_Var3 = (poly1->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  uVar1 = *(ulong *)&((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)(p_Var3 + 1))->
                     super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>;
  uVar2 = (ulong)(poly2->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
  while (p_Var3 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var3->_M_next)->
                  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var3 != (_List_node_base *)poly1) {
    local_38._words[0] = (word  [1])(*(ulong *)(p_Var3 + 1) | ~uVar1 & uVar2);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
              (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
               (value_type *)&local_38);
  }
  p_Var3 = (poly2->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  uVar1 = *(ulong *)&((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)(p_Var3 + 1))->
                     super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>;
  uVar2 = (ulong)(poly1->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
  while (p_Var3 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var3->_M_next)->
                  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var3 != (_List_node_base *)poly2) {
    local_38._words[0] = (word  [1])(*(ulong *)(p_Var3 + 1) | ~uVar1 & uVar2);
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
              (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
               (value_type *)&local_38);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}